

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

Test * __thiscall
testing::internal::TestFactoryImpl<PretransformVerticesTest_testProcessKeepHierarchy_Test>::
CreateTest(TestFactoryImpl<PretransformVerticesTest_testProcessKeepHierarchy_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x20);
  Test::Test(this_00);
  this_00[1]._vptr_Test = (_func_int **)0x0;
  this_00[1].gtest_flag_saver_.ptr_ = (GTestFlagSaver *)0x0;
  this_00->_vptr_Test = (_func_int **)&PTR__Test_008e4970;
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }